

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.h
# Opt level: O3

int __thiscall
soplex::SPxEquiliSC<double>::clone
          (SPxEquiliSC<double> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DataArray<int> *pDVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x40);
  pDVar1 = (this->super_SPxScaler<double>).m_activeColscaleExp;
  puVar2[1] = (this->super_SPxScaler<double>).m_name;
  puVar2[2] = pDVar1;
  puVar2[3] = (this->super_SPxScaler<double>).m_activeRowscaleExp;
  *(bool *)(puVar2 + 4) = (this->super_SPxScaler<double>).m_colFirst;
  *(bool *)((long)puVar2 + 0x21) = (this->super_SPxScaler<double>).m_doBoth;
  puVar2[5] = (this->super_SPxScaler<double>).spxout;
  puVar2[6] = 0;
  puVar2[7] = 0;
  *puVar2 = &PTR_setup_003b07c8;
  return (int)puVar2;
}

Assistant:

inline virtual SPxScaler<R>* clone() const override
   {
      return new SPxEquiliSC<R>(*this);
   }